

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testDeserializeAndValidateQuoteRequest(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  allocator<char> local_27d;
  int local_27c;
  string string;
  STRING local_220;
  NoRelatedSym noRelatedSym;
  QuoteRequest message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&string,"1",(allocator<char> *)&local_220);
  FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&noRelatedSym,&string);
  FIX42::QuoteRequest::QuoteRequest(&message,(QuoteReqID *)&noRelatedSym);
  local_27c = count;
  FIX::FieldBase::~FieldBase((FieldBase *)&noRelatedSym);
  std::__cxx11::string::~string((string *)&string);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym(&noRelatedSym);
  iVar3 = 10;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"IBM",&local_27d);
    FIX::Symbol::Symbol((Symbol *)&string,&local_220);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Symbol *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    std::__cxx11::string::~string((string *)&local_220);
    FIX::MaturityMonthYear::MaturityMonthYear((MaturityMonthYear *)&string);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(MaturityMonthYear *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    FIX::PutOrCall::PutOrCall((PutOrCall *)&string,0);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(PutOrCall *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    local_220._M_dataplus._M_p = (pointer)0x405e000000000000;
    FIX::StrikePrice::StrikePrice((StrikePrice *)&string,(PRICE *)&local_220);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(StrikePrice *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    FIX::Side::Side((Side *)&string,"11FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Side *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    local_220._M_dataplus._M_p = (pointer)0x4059000000000000;
    FIX::OrderQty::OrderQty((OrderQty *)&string,(QTY *)&local_220);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrderQty *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"USD",&local_27d);
    FIX::Currency::Currency((Currency *)&string,&local_220);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Currency *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    std::__cxx11::string::~string((string *)&local_220);
    FIX::OrdType::OrdType((OrdType *)&string,"1FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrdType *)&string);
    FIX::FieldBase::~FieldBase((FieldBase *)&string);
    FIX::Message::addGroup((Message *)&message,&noRelatedSym.super_Group);
  }
  FIX::Message::toString_abi_cxx11_((int)&string,(int)&message,8);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < local_27c) {
    iVar3 = local_27c;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::Message::setString
              ((Message *)&message,&string,true,
               (DataDictionary *)
               s_dataDictionary._M_t.
               super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
               .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&string);
  FIX::FieldMap::~FieldMap((FieldMap *)&noRelatedSym);
  FIX::Message::~Message((Message *)&message);
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeAndValidateQuoteRequest(int count) {
  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for (int i = 1; i <= 10; ++i) {
    noRelatedSym.set(FIX::Symbol("IBM"));
    noRelatedSym.set(FIX::MaturityMonthYear());
    noRelatedSym.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    noRelatedSym.set(FIX::StrikePrice(120));
    noRelatedSym.set(FIX::Side(FIX::Side_BUY));
    noRelatedSym.set(FIX::OrderQty(100));
    noRelatedSym.set(FIX::Currency("USD"));
    noRelatedSym.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(noRelatedSym);
  }
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    message.setString(string, VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}